

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepTiledOutputFile::setFrameBuffer(DeepTiledOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  byte bVar1;
  byte bVar2;
  pthread_mutex_t *__mutex;
  size_t sVar3;
  double dVar4;
  size_t sVar5;
  bool bVar6;
  PixelType PVar7;
  undefined4 uVar8;
  undefined8 __src;
  undefined8 uVar9;
  int iVar10;
  ChannelList *this_00;
  const_iterator cVar11;
  ConstIterator CVar12;
  ConstIterator CVar13;
  const_iterator cVar14;
  Slice *pSVar15;
  pointer ppTVar16;
  pointer ppTVar17;
  ArgExc *pAVar18;
  ostream *poVar19;
  char *pcVar20;
  size_t __n;
  pointer __src_00;
  ulong uVar21;
  DeepFrameBuffer *__n_00;
  Data *pDVar22;
  ulong __n_01;
  vector<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
  slices;
  value_type local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar10 = pthread_mutex_lock(__mutex);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  this_00 = Header::channels(&this->_data->header);
  for (cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00); CVar12 = ChannelList::end(this_00),
      (const_iterator)cVar11._M_node != CVar12._i._M_node;
      cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node)) {
    CVar13 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar11._M_node + 1));
    cVar14._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar13._i._M_node != (const_iterator)cVar14._M_node) {
      if (cVar11._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar13._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Pixel type of \"",0xf);
        poVar19 = std::operator<<((ostream *)&local_1a8,(char *)(cVar11._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,"\" channel of output file \"",0x1a);
        pcVar20 = OStream::fileName(this->_data->_streamData->os);
        poVar19 = std::operator<<(poVar19,pcVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,"\" is not compatible with the frame buffer\'s pixel type.",0x37);
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,(stringstream *)local_1b8);
        __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if ((*(int *)((long)CVar13._i._M_node + 0x140) != 1) ||
         (*(int *)((long)CVar13._i._M_node + 0x144) != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"All channels in a tiled file must havesampling (1,1).",
                   0x35);
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,(stringstream *)local_1b8);
        __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
    }
  }
  pSVar15 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar15->base == (char *)0x0) {
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pDVar22 = this->_data;
  pDVar22->sampleCountSliceBase = pSVar15->base;
  sVar5 = pSVar15->yStride;
  pDVar22->sampleCountXStride = (int)pSVar15->xStride;
  pDVar22->sampleCountYStride = (int)sVar5;
  pDVar22->sampleCountXTileCoords = (uint)pSVar15->xTileCoords;
  pDVar22->sampleCountYTileCoords = (uint)pSVar15->yTileCoords;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (pointer)0x0;
  cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00);
  for (; CVar12 = ChannelList::end(this_00), (const_iterator)cVar11._M_node != CVar12._i._M_node;
      cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node)) {
    CVar13 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar11._M_node + 1));
    cVar14._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar13._i._M_node == (const_iterator)cVar14._M_node) {
      local_1c0 = (value_type)operator_new(0x38);
      local_1c0->type = cVar11._M_node[9]._M_color;
      local_1c0->sampleStride = 0;
      local_1c0->xStride = 0;
      local_1c0->yStride = 0;
      local_1c0->zero = true;
      local_1c0->xTileCoords = 0;
      local_1c0->yTileCoords = 0;
      std::
      vector<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::push_back((vector<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                   *)local_1b8,&local_1c0);
    }
    else {
      local_1c0 = (value_type)operator_new(0x38);
      iVar10 = *(int *)((long)CVar13._i._M_node + 0x154);
      bVar1 = *(byte *)((long)CVar13._i._M_node + 0x150);
      bVar2 = *(byte *)((long)CVar13._i._M_node + 0x151);
      local_1c0->type = *(PixelType *)((long)CVar13._i._M_node + 0x120);
      local_1c0->sampleStride = (long)iVar10;
      sVar5 = *(size_t *)((long)CVar13._i._M_node + 0x138);
      local_1c0->xStride = *(size_t *)((long)CVar13._i._M_node + 0x130);
      local_1c0->yStride = sVar5;
      local_1c0->zero = false;
      local_1c0->xTileCoords = (uint)bVar1;
      local_1c0->yTileCoords = (uint)bVar2;
      std::
      vector<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::push_back((vector<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                   *)local_1b8,&local_1c0);
      (*(pointer)(local_1b8._8_8_ + -8))->base = *(char **)((long)CVar13._i._M_node + 0x128);
    }
  }
  pDVar22 = this->_data;
  __n_00 = frameBuffer;
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&pDVar22->frameBuffer,
              (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)frameBuffer);
  bVar6 = (frameBuffer->_sampleCounts).yTileCoords;
  (pDVar22->frameBuffer)._sampleCounts.xTileCoords = (frameBuffer->_sampleCounts).xTileCoords;
  (pDVar22->frameBuffer)._sampleCounts.yTileCoords = bVar6;
  PVar7 = (frameBuffer->_sampleCounts).type;
  uVar8 = *(undefined4 *)&(frameBuffer->_sampleCounts).field_0x4;
  pcVar20 = (frameBuffer->_sampleCounts).base;
  sVar5 = (frameBuffer->_sampleCounts).xStride;
  sVar3 = (frameBuffer->_sampleCounts).yStride;
  iVar10 = (frameBuffer->_sampleCounts).ySampling;
  dVar4 = (frameBuffer->_sampleCounts).fillValue;
  (pDVar22->frameBuffer)._sampleCounts.xSampling = (frameBuffer->_sampleCounts).xSampling;
  (pDVar22->frameBuffer)._sampleCounts.ySampling = iVar10;
  (pDVar22->frameBuffer)._sampleCounts.fillValue = dVar4;
  (pDVar22->frameBuffer)._sampleCounts.xStride = sVar5;
  (pDVar22->frameBuffer)._sampleCounts.yStride = sVar3;
  (pDVar22->frameBuffer)._sampleCounts.type = PVar7;
  *(undefined4 *)&(pDVar22->frameBuffer)._sampleCounts.field_0x4 = uVar8;
  (pDVar22->frameBuffer)._sampleCounts.base = pcVar20;
  pDVar22 = this->_data;
  ppTVar16 = (pDVar22->slices).
             super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar17 = (pDVar22->slices).
             super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar17 == ppTVar16) {
    __n = 0;
  }
  else {
    uVar21 = 0;
    do {
      __n_00 = (DeepFrameBuffer *)&DAT_00000038;
      operator_delete(ppTVar16[uVar21],0x38);
      uVar21 = uVar21 + 1;
      pDVar22 = this->_data;
      ppTVar16 = (pDVar22->slices).
                 super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar17 = (pDVar22->slices).
                 super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      __n = (long)ppTVar17 - (long)ppTVar16;
    } while (uVar21 < (ulong)((long)__n >> 3));
  }
  __src = local_1b8._0_8_;
  uVar9 = local_1b8._8_8_;
  uVar21 = local_1b8._8_8_ - local_1b8._0_8_;
  if ((ulong)((long)(pDVar22->slices).
                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar16) < uVar21) {
    ppTVar16 = std::
               _Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                              *)((long)uVar21 >> 3),(size_t)__n_00);
    if (uVar9 != __src) {
      memcpy(ppTVar16,(void *)__src,uVar21);
    }
    ppTVar17 = (pDVar22->slices).
               super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppTVar17 != (pointer)0x0) {
      operator_delete(ppTVar17,(long)(pDVar22->slices).
                                     super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppTVar17);
    }
    (pDVar22->slices).
    super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppTVar16;
    (pDVar22->slices).
    super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppTVar16 + uVar21);
  }
  else {
    if (__n < uVar21) {
      if (ppTVar17 != ppTVar16) {
        memmove(ppTVar16,(void *)local_1b8._0_8_,__n);
        ppTVar17 = (pDVar22->slices).
                   super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppTVar17 -
              (long)(pDVar22->slices).
                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      __src_00 = (pointer)(__n + __src);
      __n_01 = uVar9 - (long)__src_00;
      if (__n_01 == 0) goto LAB_00172b47;
    }
    else {
      __n_01 = uVar21;
      __src_00 = (pointer)local_1b8._0_8_;
      ppTVar17 = ppTVar16;
      if (local_1b8._8_8_ == local_1b8._0_8_) goto LAB_00172b47;
    }
    memmove(ppTVar17,__src_00,__n_01);
  }
LAB_00172b47:
  (pDVar22->slices).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar21 + (long)(pDVar22->slices).
                                super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  if ((pointer)__src != (pointer)0x0) {
    operator_delete((void *)__src,(long)local_1a8 - __src);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledOutputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");

        if (j.slice ().xSampling != 1 || j.slice ().ySampling != 1)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "All channels in a tiled file must have"
                "sampling (1,1).");
    }

    //
    // Store the pixel sample count table.
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice ();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = static_cast<int> (sampleCountSlice.xStride);
        _data->sampleCountYStride = static_cast<int> (sampleCountSlice.yStride);
        _data->sampleCountXTileCoords = sampleCountSlice.xTileCoords;
        _data->sampleCountYTileCoords = sampleCountSlice.yTileCoords;
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    //

    vector<TOutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new TOutSliceInfo (
                i.channel ().type,
                0,      // sampleStride,
                0,      // xStride
                0,      // yStride
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new TOutSliceInfo (
                j.slice ().type,
                j.slice ().sampleStride,
                j.slice ().xStride,
                j.slice ().yStride,
                false, // zero
                (j.slice ().xTileCoords) ? 1 : 0,
                (j.slice ().yTileCoords) ? 1 : 0));

            TOutSliceInfo* slice = slices.back ();
            slice->base          = j.slice ().base;
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size (); i++)
        delete _data->slices[i];
    _data->slices = slices;
}